

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::ftranAPF(HFactor *this,HVector *vector)

{
  HighsInt *rhs_index;
  double *rhs_array;
  pointer piVar1;
  uint uVar2;
  long lVar3;
  HighsInt rhs_count;
  
  rhs_count = vector->count;
  uVar2 = (uint)((ulong)((long)(this->pf_pivot_value).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->pf_pivot_value).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar2) {
    rhs_index = (vector->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    rhs_array = (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar3 = (ulong)(uVar2 & 0x7fffffff) + 1;
    do {
      piVar1 = (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      solveMatrixT(piVar1[lVar3 * 2 + -3],piVar1[lVar3 * 2 + -2],piVar1[lVar3 * 2 + -4],
                   piVar1[lVar3 * 2 + -3],
                   (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (this->pf_pivot_value).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar3 + -2],&rhs_count,rhs_index,
                   rhs_array);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  vector->count = rhs_count;
  return;
}

Assistant:

void HFactor::ftranAPF(HVector& vector) const {
  // Alias to non constant
  HighsInt rhs_count = vector.count;
  HighsInt* rhs_index = vector.index.data();
  double* rhs_array = vector.array.data();

  // Backwardly
  HighsInt pf_pivot_count = pf_pivot_value.size();
  for (HighsInt i = pf_pivot_count - 1; i >= 0; i--) {
    solveMatrixT(pf_start[i * 2 + 1], pf_start[i * 2 + 2], pf_start[i * 2],
                 pf_start[i * 2 + 1], pf_index.data(), pf_value.data(),
                 pf_pivot_value[i], &rhs_count, rhs_index, rhs_array);
  }

  // Remove cancellation
  vector.count = rhs_count;
}